

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  long in_FS_OFFSET;
  int status_value;
  int local_140;
  int local_13c;
  string local_138;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ != true) {
LAB_00159026:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar2;
    }
    goto LAB_0015941f;
  }
  DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
  do {
    _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x2c,&local_13c,0);
    if (_Var1 != -1) {
      (this->super_DeathTestImpl).status_ = local_13c;
      iVar2 = local_13c;
      goto LAB_00159026;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_118);
  local_f8 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_f8 == plVar6) {
    local_e8 = *plVar6;
    lStack_e0 = plVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar6;
  }
  local_f0 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_d8 = (ulong *)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if (local_d8 == puVar7) {
    local_c8 = *puVar7;
    lStack_c0 = plVar4[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar7;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_140 = 0x407;
  StreamableToString<int>(&local_138,&local_140);
  uVar9 = 0xf;
  if (local_d8 != &local_c8) {
    uVar9 = local_c8;
  }
  if (uVar9 < local_138._M_string_length + local_d0) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      uVar10 = local_138.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_138._M_string_length + local_d0) goto LAB_0015912e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_0015912e:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_138._M_dataplus._M_p);
  }
  local_b8 = (long *)*puVar5;
  plVar4 = puVar5 + 2;
  if (local_b8 == plVar4) {
    local_a8 = *plVar4;
    uStack_a0 = puVar5[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar4;
  }
  local_b0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_98 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_98 == plVar6) {
    local_88 = *plVar6;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar6;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_78 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_78 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar6;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_58._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_58._M_dataplus._M_p == psVar8) {
    local_58.field_2._M_allocated_capacity = *psVar8;
    local_58.field_2._8_8_ = plVar4[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar8;
  }
  local_58._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    DeathTestAbort(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(extraout_RAX);
    }
  }
LAB_0015941f:
  __stack_chk_fail();
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}